

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GraphicsTypesX.hpp
# Opt level: O0

TilePipelineStateCreateInfoX * __thiscall
Diligent::TilePipelineStateCreateInfoX::Clear(TilePipelineStateCreateInfoX *this)

{
  undefined1 local_190 [8];
  TilePipelineStateCreateInfoX CleanDesc;
  TilePipelineStateCreateInfoX *this_local;
  
  CleanDesc.
  super_PipelineStateCreateInfoX<Diligent::TilePipelineStateCreateInfoX,_Diligent::TilePipelineStateCreateInfo>
  .InternalData._M_t.super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>.
  _M_t.super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
  super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl =
       (__uniq_ptr_data<unsigned_char,_std::default_delete<unsigned_char[]>,_true,_true>)
       (__uniq_ptr_data<unsigned_char,_std::default_delete<unsigned_char[]>,_true,_true>)this;
  TilePipelineStateCreateInfoX((TilePipelineStateCreateInfoX *)local_190);
  std::swap<Diligent::TilePipelineStateCreateInfoX>(this,(TilePipelineStateCreateInfoX *)local_190);
  ~TilePipelineStateCreateInfoX((TilePipelineStateCreateInfoX *)local_190);
  return this;
}

Assistant:

TilePipelineStateCreateInfoX& Clear()
    {
        TilePipelineStateCreateInfoX CleanDesc;
        std::swap(*this, CleanDesc);
        return *this;
    }